

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZPersistenceManager.cpp
# Opt level: O0

void TPZPersistenceManager::WriteToFile(TPZSavable *obj)

{
  TPZSavable *pTVar1;
  int iVar2;
  TPZContBufferedStream *this;
  ulong uVar3;
  long *plVar4;
  int64_t iVar5;
  TPZSavable **ppTVar6;
  TPZContBufferedStream *in_RDI;
  TPZContBufferedStream *unaff_retaddr;
  uint size;
  int classId;
  TPZSavable *pointer;
  uint nMainObjIds;
  int64_t objId;
  TPZSavable *in_stack_00000068;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  int64_t in_stack_ffffffffffffffc8;
  uint *p;
  TPZVec<long> *in_stack_ffffffffffffffd0;
  
  this = (TPZContBufferedStream *)ScheduleToWrite(in_stack_00000068);
  uVar3 = TPZVec<long>::size(&mMainObjIds);
  TPZVec<long>::resize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  plVar4 = TPZVec<long>::operator[](&mMainObjIds,uVar3 & 0xffffffff);
  *plVar4 = (long)this;
  while( true ) {
    p = (uint *)mNextPointerToSave;
    iVar5 = TPZVec<const_TPZSavable_*>::size(&mPointersToSave);
    if (iVar5 <= (long)p) break;
    TPZContBufferedStream::Write(this,(int64_t *)p,0);
    ppTVar6 = TPZVec<const_TPZSavable_*>::operator[](&mPointersToSave,mNextPointerToSave);
    pTVar1 = *ppTVar6;
    iVar2 = (*pTVar1->_vptr_TPZSavable[4])();
    if ((iVar2 == -1) || (iVar2 == 0x29a)) {
      pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
    }
    TPZContBufferedStream::Write(this,(int *)p,0);
    TPZContBufferedStream::clear(&mCurrentObjectStream);
    (*pTVar1->_vptr_TPZSavable[5])(pTVar1,&mCurrentObjectStream,0);
    TPZContBufferedStream::Size(&mCurrentObjectStream);
    TPZContBufferedStream::Write(this,p,0);
    TPZContBufferedStream::operator<<(unaff_retaddr,in_RDI);
    mNextPointerToSave = mNextPointerToSave + 1;
  }
  return;
}

Assistant:

void TPZPersistenceManager::WriteToFile(const TPZSavable *obj) {
#ifdef PZDEBUG
    PopulateClassIdMap();
    bool ClassIdError = false;
#endif
    auto objId = ScheduleToWrite(obj);
    unsigned int nMainObjIds = mMainObjIds.size();
    mMainObjIds.resize(nMainObjIds + 1);
    mMainObjIds[nMainObjIds] = objId;

#ifdef PZDEBUG    
    uint64_t written = 0x46;
#endif
    for (; mNextPointerToSave < mPointersToSave.size(); ++mNextPointerToSave) {
        // writes obj-id
        mObjectsStream.Write(&mNextPointerToSave, 1);
        auto pointer = mPointersToSave[mNextPointerToSave];
        // writes classId
        auto classId = pointer->ClassId();
        if (classId == -1 || classId == 666) {
            DebugStop();
        }
#ifdef PZDEBUG
        {
            auto &classidmap = TPZSavable::ClassIdMap();
            if(classidmap.find(classId) == classidmap.end())
            {
                std::cout << "ClassId not registered for a pointer " << classId << std::endl;
                std::cout << "Class name " << typeid(*pointer).name() << std::endl;
                ClassIdError = true;
            }
        }
#endif
        mObjectsStream.Write(&classId, 1);
        // writes object data
        mCurrentObjectStream.clear();
        pointer->Write(mCurrentObjectStream, 0);
        unsigned int size = mCurrentObjectStream.Size();
        mObjectsStream.Write(&size, 1);
        mObjectsStream << mCurrentObjectStream;
#ifdef PZDEBUG
#ifdef VerboseMode_Q
        std::cout << " ObjId: " << mNextPointerToSave
                << " Class name: " << typeid(*pointer).name()
                << " ClassId: " << classId
                << " range: " << written + 1 << " (0x" << std::hex << written + 1 << std::dec << ") - "
                << written + sizeof (int64_t) + 2 * sizeof (int) +size
                << "(0x" << std::hex << written + sizeof (int64_t) + 2 * sizeof (int) +size << ")" << std::dec
                << " size: " << size << std::endl;
        written += sizeof (int64_t) + 2 * sizeof (int) +size;
#endif
#endif
    }
#ifdef PZDEBUG
    if(ClassIdError)
    {
        DebugStop();
    }
#endif
}